

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

ProgressData * __thiscall
duckdb::IEJoinGlobalSourceState::GetProgress
          (ProgressData *__return_storage_ptr__,IEJoinGlobalSourceState *this)

{
  __int_type _Var1;
  __int_type _Var2;
  ulong uVar3;
  ulong uVar4;
  __int_type _Var5;
  reference pvVar6;
  type pGVar7;
  type pGVar8;
  const_reference pvVar9;
  pointer pSVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  lVar14 = 0;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[](&this->gsink->tables,0);
  pGVar7 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar6);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[](&this->gsink->tables,1);
  pGVar8 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar6);
  if ((pGVar7->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pGVar7->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](&(pGVar7->global_sort_state).sorted_blocks,0);
    pSVar10 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(pvVar9);
    lVar14 = (long)(pSVar10->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar10->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  if ((pGVar8->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pGVar8->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar11 = 0;
  }
  else {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](&(pGVar8->global_sort_state).sorted_blocks,0);
    pSVar10 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(pvVar9);
    lVar11 = (long)(pSVar10->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar10->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  _Var1 = (this->left_outers).super___atomic_base<unsigned_long>._M_i;
  _Var2 = (this->right_outers).super___atomic_base<unsigned_long>._M_i;
  uVar3 = (this->next_left).super___atomic_base<unsigned_long>._M_i;
  uVar13 = (this->left_outers).super___atomic_base<unsigned_long>._M_i;
  uVar4 = (this->next_right).super___atomic_base<unsigned_long>._M_i;
  uVar12 = (this->right_outers).super___atomic_base<unsigned_long>._M_i;
  _Var5 = (this->completed).super___atomic_base<unsigned_long>._M_i;
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  lVar14 = _Var2 + _Var1 + lVar11 * lVar14;
  if (lVar14 == 0) {
    __return_storage_ptr__->invalid = true;
    __return_storage_ptr__->done = 0.0;
    dVar15 = 1.0;
  }
  else {
    if (uVar4 < uVar12) {
      uVar12 = uVar4;
    }
    if (uVar3 < uVar13) {
      uVar13 = uVar3;
    }
    lVar11 = _Var5 + uVar13 + uVar12;
    auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    auVar16._12_4_ = 0x45300000;
    __return_storage_ptr__->done =
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    auVar17._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar17._0_8_ = lVar14;
    auVar17._12_4_ = 0x45300000;
    dVar15 = (auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
  }
  __return_storage_ptr__->total = dVar15;
  return __return_storage_ptr__;
}

Assistant:

ProgressData GetProgress() const {
		auto &left_table = *gsink.tables[0];
		auto &right_table = *gsink.tables[1];

		const auto left_blocks = left_table.BlockCount();
		const auto right_blocks = right_table.BlockCount();
		const auto pair_count = left_blocks * right_blocks;

		const auto count = pair_count + left_outers + right_outers;

		const auto l = MinValue(next_left.load(), left_outers.load());
		const auto r = MinValue(next_right.load(), right_outers.load());
		const auto returned = completed.load() + l + r;

		ProgressData res;
		if (count) {
			res.done = double(returned);
			res.total = double(count);
		} else {
			res.SetInvalid();
		}
		return res;
	}